

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::AllocStackClosure(Lowerer *this)

{
  Func::StackAllocate(this->m_func,this->m_func->m_localFrameDisplaySym,8);
  Func::StackAllocate(this->m_func,this->m_func->m_localClosureSym,8);
  return;
}

Assistant:

void
Lowerer::AllocStackClosure()
{
    m_func->StackAllocate(m_func->GetLocalFrameDisplaySym(), sizeof(Js::Var));
    m_func->StackAllocate(m_func->GetLocalClosureSym(), sizeof(Js::Var));
}